

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NutDecompiler.cpp
# Opt level: O1

void __thiscall VMState::PushUnknownOpcode(VMState *this)

{
  CommentStatement *this_00;
  ostringstream text;
  StatementPtr local_1c8;
  string local_1b8;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  NutFunction::PrintOpcode
            (this->m_Parent,(ostream *)local_198,this->m_IP + -1,
             (this->m_Parent->m_Instructions).
             super__Vector_base<NutFunction::Instruction,_std::allocator<NutFunction::Instruction>_>
             ._M_impl.super__Vector_impl_data._M_start + (long)this->m_IP + -1);
  this_00 = (CommentStatement *)operator_new(0x38);
  std::__cxx11::stringbuf::str();
  CommentStatement::CommentStatement(this_00,&local_1b8);
  local_1c8.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<CommentStatement*>
            (&local_1c8.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             this_00);
  std::__shared_ptr<Statement,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<CommentStatement,CommentStatement>
            ((__shared_ptr<Statement,(__gnu_cxx::_Lock_policy)2> *)&local_1c8,this_00);
  PushStatement(this,&local_1c8);
  if (local_1c8.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1c8.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void PushUnknownOpcode( void )
	{
		std::ostringstream text;
		m_Parent.PrintOpcode(text, IP() - 1, m_Parent.m_Instructions[IP() - 1]);
		PushStatement(StatementPtr(new CommentStatement(text.str())));
	}